

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.cpp
# Opt level: O0

void __thiscall apngasm_cli::CLI::CLI(CLI *this,int argc,char **argv)

{
  int overwriteMode;
  CustomAPNGAsmListener *this_00;
  char **argv_local;
  int argc_local;
  CLI *this_local;
  
  Options::Options(&this->options,argc,argv);
  apngasm::APNGAsm::APNGAsm(&this->assembler);
  this_00 = (CustomAPNGAsmListener *)operator_new(0x18);
  overwriteMode = Options::getOverwriteMode(&this->options);
  anon_unknown.dwarf_52e64::CustomAPNGAsmListener::CustomAPNGAsmListener
            (this_00,&this->assembler,overwriteMode);
  this->pListener = (IAPNGAsmListener *)this_00;
  apngasm::APNGAsm::setAPNGAsmListener((IAPNGAsmListener *)&this->assembler);
  return;
}

Assistant:

CLI::CLI(int argc, char **argv) : options(argc, argv), assembler() {
  pListener = new CustomAPNGAsmListener(&assembler, options.getOverwriteMode());
  assembler.setAPNGAsmListener(pListener);
}